

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O1

int run_test_pipe_bind_error_addrinuse(void)

{
  int iVar1;
  int extraout_EAX;
  undefined1 *puVar2;
  undefined1 *puVar3;
  undefined8 uVar4;
  code *unaff_RBX;
  undefined1 *puVar5;
  uv_pipe_t server2;
  uv_pipe_t server1;
  undefined1 auStack_560 [264];
  code *pcStack_458;
  undefined1 auStack_448 [264];
  code *pcStack_340;
  undefined1 auStack_330 [264];
  code *pcStack_228;
  code *pcStack_220;
  undefined1 auStack_218 [264];
  undefined1 local_110 [264];
  
  puVar5 = auStack_218;
  puVar3 = auStack_218;
  pcStack_220 = (code *)0x164c95;
  puVar2 = (undefined1 *)uv_default_loop();
  pcStack_220 = (code *)0x164ca7;
  iVar1 = uv_pipe_init(puVar2,local_110,0);
  if (iVar1 == 0) {
    puVar2 = local_110;
    pcStack_220 = (code *)0x164cc3;
    iVar1 = uv_pipe_bind(puVar2,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_00164daf;
    pcStack_220 = (code *)0x164cd0;
    puVar2 = (undefined1 *)uv_default_loop();
    pcStack_220 = (code *)0x164cdd;
    iVar1 = uv_pipe_init(puVar2,auStack_218,0);
    if (iVar1 != 0) goto LAB_00164db4;
    pcStack_220 = (code *)0x164cf4;
    iVar1 = uv_pipe_bind(auStack_218,"/tmp/uv-test-sock");
    if (iVar1 != -0x62) goto LAB_00164db9;
    puVar5 = local_110;
    pcStack_220 = (code *)0x164d11;
    iVar1 = uv_listen(puVar5,0x1000,0);
    if (iVar1 != 0) goto LAB_00164dbe;
    pcStack_220 = (code *)0x164d28;
    iVar1 = uv_listen(auStack_218,0x1000,0);
    if (iVar1 != -0x16) goto LAB_00164dc3;
    unaff_RBX = close_cb;
    pcStack_220 = (code *)0x164d48;
    uv_close(local_110,close_cb);
    pcStack_220 = (code *)0x164d53;
    uv_close(auStack_218,close_cb);
    pcStack_220 = (code *)0x164d58;
    puVar3 = (undefined1 *)uv_default_loop();
    pcStack_220 = (code *)0x164d62;
    uv_run(puVar3,0);
    if (close_cb_called != 2) goto LAB_00164dc8;
    pcStack_220 = (code *)0x164d70;
    unaff_RBX = (code *)uv_default_loop();
    pcStack_220 = (code *)0x164d84;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_220 = (code *)0x164d8e;
    uv_run(unaff_RBX,0);
    pcStack_220 = (code *)0x164d93;
    puVar3 = (undefined1 *)uv_default_loop();
    pcStack_220 = (code *)0x164d9b;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_220 = (code *)0x164daf;
    run_test_pipe_bind_error_addrinuse_cold_1();
LAB_00164daf:
    pcStack_220 = (code *)0x164db4;
    run_test_pipe_bind_error_addrinuse_cold_2();
LAB_00164db4:
    puVar5 = puVar2;
    pcStack_220 = (code *)0x164db9;
    run_test_pipe_bind_error_addrinuse_cold_3();
LAB_00164db9:
    pcStack_220 = (code *)0x164dbe;
    run_test_pipe_bind_error_addrinuse_cold_4();
LAB_00164dbe:
    puVar3 = puVar5;
    pcStack_220 = (code *)0x164dc3;
    run_test_pipe_bind_error_addrinuse_cold_5();
LAB_00164dc3:
    pcStack_220 = (code *)0x164dc8;
    run_test_pipe_bind_error_addrinuse_cold_6();
LAB_00164dc8:
    pcStack_220 = (code *)0x164dcd;
    run_test_pipe_bind_error_addrinuse_cold_7();
  }
  pcStack_220 = close_cb;
  run_test_pipe_bind_error_addrinuse_cold_8();
  if (puVar3 != (undefined1 *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX;
  }
  pcStack_228 = run_test_pipe_bind_error_addrnotavail;
  close_cb_cold_1();
  pcStack_340 = (code *)0x164df1;
  pcStack_228 = unaff_RBX;
  uVar4 = uv_default_loop();
  pcStack_340 = (code *)0x164e00;
  iVar1 = uv_pipe_init(uVar4,auStack_330,0);
  if (iVar1 == 0) {
    pcStack_340 = (code *)0x164e15;
    iVar1 = uv_pipe_bind(auStack_330,"/path/to/unix/socket/that/really/should/not/be/there");
    if (iVar1 != -0xd) goto LAB_00164e87;
    pcStack_340 = (code *)0x164e2b;
    uv_close(auStack_330,close_cb);
    pcStack_340 = (code *)0x164e30;
    uVar4 = uv_default_loop();
    pcStack_340 = (code *)0x164e3a;
    uv_run(uVar4,0);
    if (close_cb_called != 1) goto LAB_00164e8c;
    pcStack_340 = (code *)0x164e48;
    unaff_RBX = (code *)uv_default_loop();
    pcStack_340 = (code *)0x164e5c;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_340 = (code *)0x164e66;
    uv_run(unaff_RBX,0);
    pcStack_340 = (code *)0x164e6b;
    uVar4 = uv_default_loop();
    pcStack_340 = (code *)0x164e73;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_340 = (code *)0x164e87;
    run_test_pipe_bind_error_addrnotavail_cold_1();
LAB_00164e87:
    pcStack_340 = (code *)0x164e8c;
    run_test_pipe_bind_error_addrnotavail_cold_2();
LAB_00164e8c:
    pcStack_340 = (code *)0x164e91;
    run_test_pipe_bind_error_addrnotavail_cold_3();
  }
  pcStack_340 = run_test_pipe_bind_error_inval;
  run_test_pipe_bind_error_addrnotavail_cold_4();
  pcStack_458 = (code *)0x164ea3;
  pcStack_340 = unaff_RBX;
  uVar4 = uv_default_loop();
  pcStack_458 = (code *)0x164eb2;
  iVar1 = uv_pipe_init(uVar4,auStack_448,0);
  if (iVar1 == 0) {
    pcStack_458 = (code *)0x164ecb;
    iVar1 = uv_pipe_bind(auStack_448,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_00164f56;
    pcStack_458 = (code *)0x164ee4;
    iVar1 = uv_pipe_bind(auStack_448,"/tmp/uv-test-sock2");
    if (iVar1 != -0x16) goto LAB_00164f5b;
    pcStack_458 = (code *)0x164efa;
    uv_close(auStack_448,close_cb);
    pcStack_458 = (code *)0x164eff;
    uVar4 = uv_default_loop();
    pcStack_458 = (code *)0x164f09;
    uv_run(uVar4,0);
    if (close_cb_called != 1) goto LAB_00164f60;
    pcStack_458 = (code *)0x164f17;
    unaff_RBX = (code *)uv_default_loop();
    pcStack_458 = (code *)0x164f2b;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_458 = (code *)0x164f35;
    uv_run(unaff_RBX,0);
    pcStack_458 = (code *)0x164f3a;
    uVar4 = uv_default_loop();
    pcStack_458 = (code *)0x164f42;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_458 = (code *)0x164f56;
    run_test_pipe_bind_error_inval_cold_1();
LAB_00164f56:
    pcStack_458 = (code *)0x164f5b;
    run_test_pipe_bind_error_inval_cold_2();
LAB_00164f5b:
    pcStack_458 = (code *)0x164f60;
    run_test_pipe_bind_error_inval_cold_3();
LAB_00164f60:
    pcStack_458 = (code *)0x164f65;
    run_test_pipe_bind_error_inval_cold_4();
  }
  pcStack_458 = run_test_pipe_listen_without_bind;
  run_test_pipe_bind_error_inval_cold_5();
  pcStack_458 = unaff_RBX;
  puVar2 = (undefined1 *)uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,auStack_560,0);
  if (iVar1 == 0) {
    puVar2 = auStack_560;
    iVar1 = uv_listen(puVar2,0x1000,0);
    if (iVar1 != -0x16) goto LAB_0016500d;
    uv_close(auStack_560,close_cb);
    puVar2 = (undefined1 *)uv_default_loop();
    uv_run(puVar2,0);
    if (close_cb_called == 1) {
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      puVar2 = (undefined1 *)uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00165017;
    }
  }
  else {
    run_test_pipe_listen_without_bind_cold_1();
LAB_0016500d:
    run_test_pipe_listen_without_bind_cold_2();
  }
  run_test_pipe_listen_without_bind_cold_3();
LAB_00165017:
  run_test_pipe_listen_without_bind_cold_4();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar2,0);
  return iVar1;
}

Assistant:

TEST_IMPL(pipe_bind_error_addrinuse) {
  uv_pipe_t server1, server2;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server1, 0);
  ASSERT(r == 0);
  r = uv_pipe_bind(&server1, TEST_PIPENAME);
  ASSERT(r == 0);

  r = uv_pipe_init(uv_default_loop(), &server2, 0);
  ASSERT(r == 0);
  r = uv_pipe_bind(&server2, TEST_PIPENAME);
  ASSERT(r == UV_EADDRINUSE);

  r = uv_listen((uv_stream_t*)&server1, SOMAXCONN, NULL);
  ASSERT(r == 0);
  r = uv_listen((uv_stream_t*)&server2, SOMAXCONN, NULL);
  ASSERT(r == UV_EINVAL);

  uv_close((uv_handle_t*)&server1, close_cb);
  uv_close((uv_handle_t*)&server2, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}